

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNontrappingFPToIntLowering.cpp
# Opt level: O0

Pass * wasm::createLLVMNonTrappingFPToIntLoweringPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  LLVMNonTrappingFPToIntLowering::LLVMNonTrappingFPToIntLowering
            ((LLVMNonTrappingFPToIntLowering *)this);
  return this;
}

Assistant:

Pass* createLLVMNonTrappingFPToIntLoweringPass() {
  return new LLVMNonTrappingFPToIntLowering();
}